

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_predict.h
# Opt level: O1

void MARGINAL::undo_marginal(data *sm,example *ec)

{
  byte bVar1;
  long lVar2;
  features *pfVar3;
  undefined8 *puVar4;
  features *pfVar5;
  features *pfVar6;
  byte *pbVar7;
  undefined8 local_80 [12];
  float local_20;
  
  pbVar7 = (ec->super_example_predict).indices._begin;
  if (pbVar7 != (ec->super_example_predict).indices._end) {
    do {
      bVar1 = *pbVar7;
      if (sm->id_features[bVar1] == true) {
        pfVar6 = (ec->super_example_predict).feature_space + bVar1;
        pfVar3 = sm->temp + bVar1;
        puVar4 = local_80;
        for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
          *puVar4 = (pfVar3->values)._begin;
          pfVar3 = (features *)&(pfVar3->values)._end;
          puVar4 = puVar4 + 1;
        }
        pfVar3 = pfVar6;
        pfVar5 = sm->temp + bVar1;
        for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
          (pfVar5->values)._begin = (pfVar3->values)._begin;
          pfVar3 = (features *)&(pfVar3->values)._end;
          pfVar5 = (features *)&(pfVar5->values)._end;
        }
        sm->temp[bVar1].sum_feat_sq = (ec->super_example_predict).feature_space[bVar1].sum_feat_sq;
        puVar4 = local_80;
        for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
          (pfVar6->values)._begin = (float *)*puVar4;
          puVar4 = puVar4 + 1;
          pfVar6 = (features *)&(pfVar6->values)._end;
        }
        (ec->super_example_predict).feature_space[bVar1].sum_feat_sq = local_20;
      }
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != (ec->super_example_predict).indices._end);
  }
  return;
}

Assistant:

iterator begin() { return iterator(feature_space, indices.begin()); }